

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O1

int __thiscall
icu_63::VTimeZone::clone(VTimeZone *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  VTimeZone *this_00;
  
  this_00 = (VTimeZone *)UMemory::operator_new((UMemory *)0x120,(size_t)__fn);
  if (this_00 == (VTimeZone *)0x0) {
    this_00 = (VTimeZone *)0x0;
  }
  else {
    VTimeZone(this_00,this);
  }
  return (int)this_00;
}

Assistant:

TimeZone*
VTimeZone::clone(void) const {
    return new VTimeZone(*this);
}